

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_evaluation.cpp
# Opt level: O2

void fuzzy_check(double a,double b)

{
  uint __line;
  char *__assertion;
  
  if ((ABS(a) < 1e-08) && (ABS(b) < 1e-08)) {
    return;
  }
  if (ABS(a) <= 1e-08) {
    if (ABS((a - b) / b) < 1e-10) {
      return;
    }
    __assertion = "fabs(fabs(a-b) / fabs(b)) < 1e-10";
    __line = 0x50;
  }
  else {
    if (ABS((a - b) / a) < 1e-10) {
      return;
    }
    __assertion = "fabs(fabs(a-b) / fabs(a)) < 1e-10";
    __line = 0x4e;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/tests/src/compiletime_evaluation.cpp"
                ,__line,"void fuzzy_check(double, double)");
}

Assistant:

inline void fuzzy_check(double a, double b)
{
  if (fabs(a) < 1e-8 && fabs(b) < 1e-8)
    return;

  if (fabs(a) > 1e-8)
    assert( fabs(fabs(a-b) / fabs(a)) < 1e-10);
  else
    assert( fabs(fabs(a-b) / fabs(b)) < 1e-10);
}